

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_perftest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  int64_t iVar5;
  int64_t iVar6;
  int *piVar7;
  char *pcVar8;
  bool measure_command_evaluation;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider _Var12;
  _Alloc_hider _Var13;
  float fVar14;
  int delta;
  vector<int,_std::allocator<int>_> times;
  string err;
  char kManifestDir [24];
  uint local_8c;
  string local_88;
  string local_68;
  char local_48 [24];
  
  bVar1 = true;
  do {
    measure_command_evaluation = bVar1;
    iVar2 = getopt(argc,argv,"fh");
    bVar1 = false;
  } while (iVar2 == 0x66);
  if (iVar2 == -1) {
    builtin_strncpy(local_48,"build/manifest_perftest",0x18);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    sVar4 = strlen(local_48);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,local_48,local_48 + sVar4);
    bVar1 = WriteFakeManifests(&local_88,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      iVar2 = chdir(local_48);
      if (iVar2 < 0) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        Fatal("chdir: %s",pcVar8);
      }
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity = 0;
      iVar2 = 5;
      do {
        iVar5 = GetTimeMillis();
        uVar3 = LoadManifests(measure_command_evaluation);
        iVar6 = GetTimeMillis();
        local_8c = (int)iVar6 - (int)iVar5;
        printf("%dms (hash: %x)\n",(ulong)local_8c,(ulong)uVar3);
        if (local_88._M_string_length == local_88.field_2._M_allocated_capacity) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_88,
                     (iterator)local_88._M_string_length,(int *)&local_8c);
        }
        else {
          *(uint *)local_88._M_string_length = local_8c;
          local_88._M_string_length = local_88._M_string_length + 4;
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_88._M_dataplus._M_p + 4);
      _Var9._M_p = local_88._M_dataplus._M_p;
      paVar11 = paVar10;
      _Var12._M_p = local_88._M_dataplus._M_p;
      if (paVar10 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_string_length &&
          local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
        do {
          _Var9._M_p = (pointer)paVar11;
          if ((int)*(uint *)_Var12._M_p <= (int)*(uint *)paVar11) {
            _Var9._M_p = _Var12._M_p;
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar11 + 4);
          _Var12._M_p = _Var9._M_p;
        } while (paVar11 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88._M_string_length);
      }
      _Var12._M_p = local_88._M_dataplus._M_p;
      _Var13._M_p = local_88._M_dataplus._M_p;
      if (paVar10 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_string_length &&
          local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
        do {
          _Var12._M_p = (pointer)paVar10;
          if ((int)*(uint *)paVar10 <= (int)*(uint *)_Var13._M_p) {
            _Var12._M_p = _Var13._M_p;
          }
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar10 + 4);
          _Var13._M_p = _Var12._M_p;
        } while (paVar10 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88._M_string_length);
      }
      fVar14 = 0.0;
      for (_Var13._M_p = local_88._M_dataplus._M_p;
          _Var13._M_p != (pointer)local_88._M_string_length; _Var13._M_p = _Var13._M_p + 4) {
        fVar14 = fVar14 + (float)(int)*(uint *)_Var13._M_p;
      }
      printf("min %dms  max %dms  avg %.1fms\n",
             SUB84((double)(fVar14 / (float)(ulong)((long)(local_88._M_string_length -
                                                          (long)local_88._M_dataplus._M_p) >> 2)),0)
             ,(ulong)*(uint *)_Var9._M_p,(ulong)*(uint *)_Var12._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_88._M_dataplus._M_p,
                        local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p);
      }
      iVar2 = 0;
    }
    else {
      main_cold_1();
      iVar2 = 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    puts(
        "usage: manifest_parser_perftest\n\noptions:\n  -f     only measure manifest load time, not command evaluation time"
        );
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
  bool measure_command_evaluation = true;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("fh"))) != -1) {
    switch (opt) {
    case 'f':
      measure_command_evaluation = false;
      break;
    case 'h':
    default:
      printf("usage: manifest_parser_perftest\n"
"\n"
"options:\n"
"  -f     only measure manifest load time, not command evaluation time\n"
             );
    return 1;
    }
  }

  const char kManifestDir[] = "build/manifest_perftest";

  string err;
  if (!WriteFakeManifests(kManifestDir, &err)) {
    fprintf(stderr, "Failed to write test data: %s\n", err.c_str());
    return 1;
  }

  if (chdir(kManifestDir) < 0)
    Fatal("chdir: %s", strerror(errno));

  const int kNumRepetitions = 5;
  vector<int> times;
  for (int i = 0; i < kNumRepetitions; ++i) {
    int64_t start = GetTimeMillis();
    int optimization_guard = LoadManifests(measure_command_evaluation);
    int delta = (int)(GetTimeMillis() - start);
    printf("%dms (hash: %x)\n", delta, optimization_guard);
    times.push_back(delta);
  }

  int min = *min_element(times.begin(), times.end());
  int max = *max_element(times.begin(), times.end());
  float total = accumulate(times.begin(), times.end(), 0.0f);
  printf("min %dms  max %dms  avg %.1fms\n", min, max, total / times.size());
}